

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderCollapseTriangle(ImVec2 p_min,bool is_open,float scale)

{
  ImDrawList *this;
  ImGuiContext *pIVar1;
  ImU32 col;
  ImGuiWindow *pIVar2;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_38;
  ImVec2 center;
  float r;
  float h;
  ImGuiWindow *window;
  ImGuiContext *g;
  float scale_local;
  bool is_open_local;
  ImVec2 p_min_local;
  
  pIVar1 = GImGui;
  _scale_local = p_min;
  pIVar2 = GetCurrentWindow();
  center.y = pIVar1->FontSize;
  center.x = center.y * 0.4 * scale;
  ImVec2::ImVec2(&a,center.y * 0.5,center.y * 0.5 * scale);
  local_38 = operator+((ImVec2 *)&scale_local,&a);
  ImVec2::ImVec2(&b);
  ImVec2::ImVec2(&c);
  ImVec2::ImVec2(&local_58);
  if (is_open) {
    local_38.y = local_38.y + center.x * -0.25;
    ImVec2::ImVec2(&local_70,0.0,1.0);
    local_68 = ::operator*(&local_70,center.x);
    local_60 = operator+(&local_38,&local_68);
    b = local_60;
    ImVec2::ImVec2(&local_88,-0.866,-0.5);
    local_80 = ::operator*(&local_88,center.x);
    local_78 = operator+(&local_38,&local_80);
    c = local_78;
    ImVec2::ImVec2(&local_a0,0.866,-0.5);
    local_98 = ::operator*(&local_a0,center.x);
    local_90 = operator+(&local_38,&local_98);
    local_58 = local_90;
  }
  else {
    ImVec2::ImVec2(&local_b8,1.0,0.0);
    local_b0 = ::operator*(&local_b8,center.x);
    local_a8 = operator+(&local_38,&local_b0);
    b = local_a8;
    ImVec2::ImVec2(&local_d0,-0.5,0.866);
    local_c8 = ::operator*(&local_d0,center.x);
    local_c0 = operator+(&local_38,&local_c8);
    c = local_c0;
    ImVec2::ImVec2(&local_e8,-0.5,-0.866);
    local_e0 = ::operator*(&local_e8,center.x);
    local_d8 = operator+(&local_38,&local_e0);
    local_58 = local_d8;
  }
  this = pIVar2->DrawList;
  col = GetColorU32(0,1.0);
  ImDrawList::AddTriangleFilled(this,&b,&c,&local_58,col);
  return;
}

Assistant:

void ImGui::RenderCollapseTriangle(ImVec2 p_min, bool is_open, float scale)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    const float h = g.FontSize * 1.00f;
    const float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h*0.50f, h*0.50f*scale);

    ImVec2 a, b, c;
    if (is_open)
    {
        center.y -= r*0.25f;
        a = center + ImVec2(0,1)*r;
        b = center + ImVec2(-0.866f,-0.5f)*r;
        c = center + ImVec2(0.866f,-0.5f)*r;
    }
    else
    {
        a = center + ImVec2(1,0)*r;
        b = center + ImVec2(-0.500f,0.866f)*r;
        c = center + ImVec2(-0.500f,-0.866f)*r;
    }

    window->DrawList->AddTriangleFilled(a, b, c, GetColorU32(ImGuiCol_Text));
}